

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cc
# Opt level: O1

bool __thiscall Glucose::SimpSolver::eliminateVar(SimpSolver *this,Var v)

{
  OccLists<int,_Glucose::vec<unsigned_int>,_Glucose::SimpSolver::ClauseDeleted> *this_00;
  unsigned_long *puVar1;
  uint *puVar2;
  char *pcVar3;
  Watcher *__ptr;
  bool bVar4;
  bool bVar5;
  byte bVar6;
  int iVar7;
  int iVar8;
  undefined8 extraout_RAX;
  undefined8 extraout_RAX_00;
  undefined8 uVar9;
  undefined7 uVar10;
  ulong uVar11;
  long lVar12;
  int iVar13;
  ulong uVar14;
  vec<unsigned_int> *pvVar15;
  long lVar16;
  long lVar17;
  vec<unsigned_int> *pvVar18;
  vec<Glucose::Solver::Watcher> *pvVar19;
  bool bVar20;
  vec<unsigned_int> neg;
  int clause_size;
  Var local_a0;
  byte local_9a;
  byte local_99;
  vec<unsigned_int> local_98;
  vec<unsigned_int> local_88;
  uint local_6c;
  uint *local_68;
  int local_60;
  int local_5c;
  vec<unsigned_int> *local_58;
  OccLists<int,_Glucose::vec<unsigned_int>,_Glucose::SimpSolver::ClauseDeleted> *local_50;
  ulong local_48;
  long local_40;
  uint *local_38;
  
  this_00 = &this->occurs;
  local_a0 = v;
  if ((this->occurs).dirty.data[v] != '\0') {
    OccLists<int,_Glucose::vec<unsigned_int>,_Glucose::SimpSolver::ClauseDeleted>::clean
              (this_00,&local_a0);
  }
  pvVar15 = (this_00->occs).data;
  pvVar18 = pvVar15 + local_a0;
  local_88.data = (uint *)0x0;
  local_88.sz = 0;
  local_88.cap = 0;
  local_98.data = (uint *)0x0;
  local_98.sz = 0;
  local_98.cap = 0;
  local_50 = this_00;
  if (0 < pvVar15[local_a0].sz) {
    lVar16 = 0;
    do {
      uVar14 = (ulong)pvVar18->data[lVar16];
      puVar2 = (this->super_Solver).ca.super_RegionAllocator<unsigned_int>.memory;
      uVar11 = *(ulong *)(puVar2 + uVar14) >> 0x20;
      iVar8 = (int)(*(ulong *)(puVar2 + uVar14) >> 0x20);
      bVar20 = 0 < iVar8;
      if (0 < iVar8) {
        bVar20 = true;
        if (puVar2[uVar14 + 3] != local_a0 * 2) {
          lVar17 = 0;
          do {
            lVar12 = lVar17;
            if (uVar11 - 1 == lVar12) break;
            lVar17 = lVar12 + 1;
          } while (puVar2[uVar14 + lVar12 + 4] != local_a0 * 2);
          bVar20 = lVar12 + 1U < uVar11;
        }
      }
      pvVar15 = &local_98;
      if (bVar20) {
        pvVar15 = &local_88;
      }
      vec<unsigned_int>::push(pvVar15,pvVar18->data + lVar16);
      lVar16 = lVar16 + 1;
    } while (lVar16 < pvVar18->sz);
  }
  local_60 = 0;
  local_48 = (ulong)local_88.sz;
  bVar20 = 0 < (long)local_48;
  local_58 = pvVar18;
  if (0 < (long)local_48) {
    iVar8 = local_98.sz;
    lVar16 = (long)local_98.sz;
    local_9a = 0 < lVar16;
    local_68 = local_88.data;
    local_38 = local_98.data;
    local_5c = local_a0;
    local_40 = -(local_98._8_8_ & 0xffffffff);
    uVar11 = 0;
    iVar7 = 0;
    do {
      bVar6 = local_9a;
      local_99 = bVar20;
      if (0 < iVar8) {
        lVar17 = 1;
        iVar13 = iVar7;
        do {
          puVar2 = (this->super_Solver).ca.super_RegionAllocator<unsigned_int>.memory;
          bVar20 = merge(this,(Clause *)(puVar2 + local_68[uVar11]),
                         (Clause *)(puVar2 + local_38[lVar17 + -1]),local_5c,&local_60);
          iVar7 = iVar13;
          if ((bVar20) &&
             ((iVar7 = iVar13 + 1, this->grow + local_58->sz <= iVar13 ||
              ((this->clause_lim != -1 && (this->clause_lim < local_60)))))) break;
          bVar6 = lVar17 < lVar16;
          lVar12 = local_40 + lVar17;
          lVar17 = lVar17 + 1;
          iVar13 = iVar7;
        } while (lVar12 != 0);
      }
      if ((bVar6 & 1) != 0) {
        bVar6 = 1;
        if ((local_99 & 1) != 0) goto LAB_00114064;
        break;
      }
      uVar11 = uVar11 + 1;
      bVar20 = uVar11 < local_48;
    } while (uVar11 != local_48);
  }
  (this->eliminated).data[local_a0] = '\x01';
  lVar16 = (long)local_a0;
  pcVar3 = (this->super_Solver).decision.data;
  if (pcVar3[lVar16] != '\0') {
    puVar1 = (this->super_Solver).stats.data + 0x12;
    *puVar1 = *puVar1 - 1;
  }
  pcVar3[lVar16] = '\0';
  if ((((this->super_Solver).order_heap.indices.sz <= local_a0) ||
      ((this->super_Solver).order_heap.indices.data[lVar16] < 0)) &&
     ((this->super_Solver).decision.data[lVar16] != '\0')) {
    Heap<Glucose::Solver::VarOrderLt>::insert(&(this->super_Solver).order_heap,local_a0);
  }
  this->eliminated_vars = this->eliminated_vars + 1;
  if (local_98.sz < local_88.sz) {
    if (0 < local_98.sz) {
      lVar16 = 0;
      do {
        mkElimClause(&this->elimclauses,local_a0,
                     (Clause *)
                     ((this->super_Solver).ca.super_RegionAllocator<unsigned_int>.memory +
                     local_98.data[lVar16]));
        lVar16 = lVar16 + 1;
      } while (lVar16 < local_98.sz);
    }
    local_6c = local_a0 * 2;
    vec<unsigned_int>::push(&this->elimclauses,&local_6c);
    local_6c = 1;
    vec<unsigned_int>::push(&this->elimclauses,&local_6c);
    uVar9 = extraout_RAX;
  }
  else {
    if (0 < local_88.sz) {
      lVar16 = 0;
      do {
        mkElimClause(&this->elimclauses,local_a0,
                     (Clause *)
                     ((this->super_Solver).ca.super_RegionAllocator<unsigned_int>.memory +
                     local_88.data[lVar16]));
        lVar16 = lVar16 + 1;
      } while (lVar16 < local_88.sz);
    }
    local_6c = local_a0 * 2 + 1;
    vec<unsigned_int>::push(&this->elimclauses,&local_6c);
    local_6c = 1;
    vec<unsigned_int>::push(&this->elimclauses,&local_6c);
    uVar9 = extraout_RAX_00;
  }
  bVar20 = 0 < local_88.sz;
  uVar10 = (undefined7)((ulong)uVar9 >> 8);
  if (local_88.sz < 1) {
    local_68 = (uint *)CONCAT44(local_68._4_4_,(int)CONCAT71(uVar10,1));
  }
  else {
    local_68 = (uint *)CONCAT44(local_68._4_4_,(int)CONCAT71(uVar10,1));
    lVar16 = 0;
    do {
      bVar4 = 0 < local_98.sz;
      if (0 < local_98.sz) {
        lVar17 = 0;
        do {
          puVar2 = (this->super_Solver).ca.super_RegionAllocator<unsigned_int>.memory;
          bVar5 = merge(this,(Clause *)(puVar2 + local_88.data[lVar16]),
                        (Clause *)(puVar2 + local_98.data[lVar17]),local_a0,
                        &(this->super_Solver).add_tmp);
          if ((bVar5) &&
             (iVar8 = (*(this->super_Solver).super_Clone._vptr_Clone[4])(this), (char)iVar8 == '\0')
             ) {
            local_68 = (uint *)((ulong)local_68 & 0xffffffff00000000);
            break;
          }
          lVar17 = lVar17 + 1;
          bVar4 = lVar17 < local_98.sz;
        } while (lVar17 < local_98.sz);
      }
      if (bVar4) break;
      lVar16 = lVar16 + 1;
      bVar20 = lVar16 < local_88.sz;
    } while (lVar16 < local_88.sz);
  }
  pvVar18 = local_58;
  bVar6 = (byte)local_68;
  if (!bVar20) {
    if (0 < local_58->sz) {
      lVar16 = 0;
      do {
        removeClause(this,pvVar18->data[lVar16],false);
        lVar16 = lVar16 + 1;
      } while (lVar16 < pvVar18->sz);
    }
    pvVar18 = (local_50->occs).data;
    puVar2 = pvVar18[local_a0].data;
    if (puVar2 != (uint *)0x0) {
      pvVar18 = pvVar18 + local_a0;
      pvVar18->sz = 0;
      free(puVar2);
      pvVar18->data = (uint *)0x0;
      pvVar18->cap = 0;
    }
    pvVar19 = (this->super_Solver).watches.occs.data;
    if (pvVar19[(long)local_a0 * 2].sz == 0) {
      pvVar19 = pvVar19 + (long)local_a0 * 2;
      if (pvVar19->data != (Watcher *)0x0) {
        pvVar19->sz = 0;
        free(pvVar19->data);
        pvVar19->data = (Watcher *)0x0;
        pvVar19->cap = 0;
      }
    }
    lVar16 = (long)local_a0;
    pvVar19 = (this->super_Solver).watches.occs.data;
    if (pvVar19[lVar16 * 2 + 1].sz == 0) {
      __ptr = pvVar19[lVar16 * 2 + 1].data;
      if (__ptr != (Watcher *)0x0) {
        pvVar19[lVar16 * 2 + 1].sz = 0;
        free(__ptr);
        pvVar19[lVar16 * 2 + 1].data = (Watcher *)0x0;
        pvVar19[lVar16 * 2 + 1].cap = 0;
      }
    }
    bVar6 = backwardSubsumptionCheck(this,false);
  }
LAB_00114064:
  if (local_98.data != (uint *)0x0) {
    local_98._8_8_ = local_98._8_8_ & 0xffffffff00000000;
    free(local_98.data);
    local_98.data = (uint *)0x0;
    local_98._8_8_ = local_98._8_8_ & 0xffffffff;
  }
  if (local_88.data != (uint *)0x0) {
    local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
    free(local_88.data);
  }
  return (bool)(bVar6 & 1);
}

Assistant:

bool SimpSolver::eliminateVar(Var v)
{
    assert(!frozen[v]);
    assert(!isEliminated(v));
    assert(value(v) == l_Undef);

    // Split the occurrences into positive and negative:
    //
    const vec<CRef>& cls = occurs.lookup(v);
    vec<CRef>        pos, neg;
    for (int i = 0; i < cls.size(); i++)
        (find(ca[cls[i]], mkLit(v)) ? pos : neg).push(cls[i]);

    // Check wether the increase in number of clauses stays within the allowed ('grow'). Moreover, no
    // clause must exceed the limit on the maximal clause size (if it is set):
    //
    int cnt         = 0;
    int clause_size = 0;

    for (int i = 0; i < pos.size(); i++)
        for (int j = 0; j < neg.size(); j++)
            if (merge(ca[pos[i]], ca[neg[j]], v, clause_size) && 
                (++cnt > cls.size() + grow || (clause_lim != -1 && clause_size > clause_lim)))
                return true;

    // Delete and store old clauses
    eliminated[v] = true;
    setDecisionVar(v, false);
    eliminated_vars++;

    if (pos.size() > neg.size()){
        for (int i = 0; i < neg.size(); i++)
            mkElimClause(elimclauses, v, ca[neg[i]]);
        mkElimClause(elimclauses, mkLit(v));
    }else{
        for (int i = 0; i < pos.size(); i++)
            mkElimClause(elimclauses, v, ca[pos[i]]);
        mkElimClause(elimclauses, ~mkLit(v));
    }


    // Produce clauses in cross product:
    vec<Lit>& resolvent = add_tmp;
    for (int i = 0; i < pos.size(); i++)
        for (int j = 0; j < neg.size(); j++)
            if (merge(ca[pos[i]], ca[neg[j]], v, resolvent) && !addClause_(resolvent))
                return false;

    for (int i = 0; i < cls.size(); i++)
        removeClause(cls[i]);

    // Free occurs list for this variable:
    occurs[v].clear(true);

    // Free watchers lists for this variable, if possible:
    if (watches[ mkLit(v)].size() == 0) watches[ mkLit(v)].clear(true);
    if (watches[~mkLit(v)].size() == 0) watches[~mkLit(v)].clear(true);

    return backwardSubsumptionCheck();
}